

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::PassRunner::runPassOnFunction(PassRunner *this,Pass *pass,Function *func)

{
  size_type sVar1;
  int iVar2;
  const_iterator cVar3;
  ostream *poVar4;
  AfterEffectFunctionChecker *this_00;
  size_t sVar5;
  char *pcVar6;
  __hashtable *__h;
  bool bVar7;
  Name name;
  undefined1 local_378 [392];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  stringstream bodyBefore;
  ostream local_1e0 [112];
  ios_base local_170 [264];
  char *local_68;
  long local_60;
  long *local_48;
  undefined8 local_40;
  char local_31;
  
  iVar2 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar2 == '\0') {
    __assert_fail("pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3d2,"void wasm::PassRunner::runPassOnFunction(Pass *, Function *)");
  }
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->options).passesToSkip._M_h,&pass->name);
  if (cVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_1f0 = &this->skippedPasses;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1f0,&pass->name);
    return;
  }
  iVar2 = getPassDebug();
  if (iVar2 == 2) {
    if ((this->options).validate == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1f0);
    }
    else {
      sVar1 = (pass->name)._M_string_length;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1f0);
      if (sVar1 != 0) {
        poVar4 = std::operator<<(local_1e0,func->body);
        local_378[0] = (WasmValidator)0xa;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_378,1);
        local_40 = CONCAT71((int7)((ulong)poVar4 >> 8),1);
        goto LAB_00626c06;
      }
    }
    local_40 = 0;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1f0);
    local_40 = 0;
    if (iVar2 == 0) {
      bVar7 = true;
      this_00 = (AfterEffectFunctionChecker *)0x0;
      goto LAB_00626c38;
    }
  }
LAB_00626c06:
  this_00 = (AfterEffectFunctionChecker *)operator_new(0x28);
  this_00->func = func;
  pcVar6 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  (this_00->name).super_IString.str._M_len =
       (func->super_Importable).super_Named.name.super_IString.str._M_len;
  (this_00->name).super_IString.str._M_str = pcVar6;
  bVar7 = (func->stackIR)._M_t.
          super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
          .
          super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
          ._M_head_impl != (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0;
  this_00->beganWithStackIR = bVar7;
  if (bVar7) {
    sVar5 = FunctionHasher::hashFunction(func);
    this_00->originalFunctionHash = sVar5;
  }
  bVar7 = false;
LAB_00626c38:
  (*pass->_vptr_Pass[5])(&local_48,pass);
  if ((PassRunner *)local_48[1] != this && (PassRunner *)local_48[1] != (PassRunner *)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,0x1dc,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  local_48[1] = (long)this;
  (**(code **)(*local_48 + 0x18))(local_48,this->wasm,func);
  handleAfterEffects(this,pass,func);
  if (!bVar7) {
    AfterEffectFunctionChecker::check(this_00);
  }
  if ((char)local_40 != '\0') {
    pcVar6 = (char *)0x0;
    bVar7 = WasmValidator::validate((WasmValidator *)local_378,func,this->wasm,0);
    if (!bVar7) {
      Fatal::Fatal((Fatal *)local_378);
      poVar4 = (ostream *)(local_378 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Last nested function-parallel pass (",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(pass->name)._M_dataplus._M_p,(pass->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,") broke validation of function ",0x1f);
      name.super_IString.str._M_str = pcVar6;
      name.super_IString.str._M_len =
           (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
      wasm::operator<<((wasm *)poVar4,
                       (ostream *)(func->super_Importable).super_Named.name.super_IString.str._M_len
                       ,name);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,". Here is the function body before:\n",0x24);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\nAnd here it is now:\n",0x16);
      std::operator<<(poVar4,func->body);
      local_31 = '\n';
      Fatal::operator<<((Fatal *)local_378,&local_31);
      std::__cxx11::string::~string((string *)&local_68);
      Fatal::~Fatal((Fatal *)local_378);
    }
  }
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  if (this_00 != (AfterEffectFunctionChecker *)0x0) {
    operator_delete(this_00,0x28);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f0);
  std::ios_base::~ios_base(local_170);
  return;
}

Assistant:

void PassRunner::runPassOnFunction(Pass* pass, Function* func) {
  assert(pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  auto passDebug = getPassDebug();

  // Add extra validation logic in pass-debug mode 2. The main logic in
  // PassRunner::run will work at the module level, and here for a function-
  // parallel pass we can do the same at the function level: we can print the
  // function before the pass, run the pass on the function, and then if it
  // fails to validate we can show an error and print the state right before the
  // pass broke it.
  //
  // Skip nameless passes for this. Anything without a name is an internal
  // component of some larger pass, and information about it won't be very
  // useful - leave it to the entire module to fail validation in that case.
  bool extraFunctionValidation =
    passDebug == 2 && options.validate && !pass->name.empty();
  std::stringstream bodyBefore;
  if (extraFunctionValidation) {
    bodyBefore << *func->body << '\n';
  }

  std::unique_ptr<AfterEffectFunctionChecker> checker;
  if (passDebug) {
    checker = std::make_unique<AfterEffectFunctionChecker>(func);
  }

  // Function-parallel passes get a new instance per function
  auto instance = pass->create();
  instance->setPassRunner(this);
  instance->runOnFunction(wasm, func);
  handleAfterEffects(pass, func);

  if (passDebug) {
    checker->check();
  }

  if (extraFunctionValidation) {
    if (!WasmValidator().validate(func, *wasm, WasmValidator::Minimal)) {
      Fatal() << "Last nested function-parallel pass (" << pass->name
              << ") broke validation of function " << func->name
              << ". Here is the function body before:\n"
              << bodyBefore.str() << "\n\nAnd here it is now:\n"
              << *func->body << '\n';
    }
  }
}